

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

VariableSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VariableSymbol,char_const(&)[5],slang::SourceLocation_const&,slang::ast::VariableLifetime>
          (BumpAllocator *this,char (*args) [5],SourceLocation *args_1,VariableLifetime *args_2)

{
  string_view name;
  VariableSymbol *pVVar1;
  SourceLocation in_RCX;
  size_t in_RDX;
  char *in_RSI;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  VariableLifetime in_stack_ffffffffffffffd4;
  VariableSymbol *in_stack_ffffffffffffffd8;
  
  pVVar1 = (VariableSymbol *)
           allocate((BumpAllocator *)in_stack_ffffffffffffffd8,
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (size_t)in_stack_ffffffffffffffc8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  name._M_str = in_RSI;
  name._M_len = in_RDX;
  slang::ast::VariableSymbol::VariableSymbol
            (in_stack_ffffffffffffffd8,name,in_RCX,in_stack_ffffffffffffffd4);
  return pVVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }